

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  char cVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  undefined4 uVar19;
  ulong unaff_RBX;
  ulong uVar20;
  NodeRef *pNVar21;
  NodeRef *pNVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  vint4 ai;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi_1;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi_3;
  undefined1 auVar40 [16];
  vint4 bi;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  NodeRef stack [244];
  
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar8 = fVar4 * 0.99999964;
  fVar9 = fVar5 * 0.99999964;
  fVar10 = fVar6 * 0.99999964;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar7 = (tray->tnear).field_0.i[k];
  auVar45._4_4_ = iVar7;
  auVar45._0_4_ = iVar7;
  auVar45._8_4_ = iVar7;
  auVar45._12_4_ = iVar7;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar47._4_4_ = iVar7;
  auVar47._0_4_ = iVar7;
  auVar47._8_4_ = iVar7;
  auVar47._12_4_ = iVar7;
  pNVar22 = stack + 1;
  do {
    pNVar21 = pNVar22;
    if (pNVar21 == stack) break;
    pNVar22 = pNVar21 + -1;
    sVar25 = pNVar21[-1].ptr;
    do {
      if ((sVar25 & 0xf) == 0) {
        auVar30 = vsubps_avx(*(undefined1 (*) [16])(sVar25 + 0x20 + uVar23),auVar49);
        auVar27._0_4_ = fVar8 * auVar30._0_4_;
        auVar27._4_4_ = fVar8 * auVar30._4_4_;
        auVar27._8_4_ = fVar8 * auVar30._8_4_;
        auVar27._12_4_ = fVar8 * auVar30._12_4_;
        auVar30 = vsubps_avx(*(undefined1 (*) [16])(sVar25 + 0x20 + uVar26),auVar50);
        auVar31._0_4_ = fVar9 * auVar30._0_4_;
        auVar31._4_4_ = fVar9 * auVar30._4_4_;
        auVar31._8_4_ = fVar9 * auVar30._8_4_;
        auVar31._12_4_ = fVar9 * auVar30._12_4_;
        auVar30 = vmaxps_avx(auVar27,auVar31);
        auVar27 = vsubps_avx(*(undefined1 (*) [16])(sVar25 + 0x20 + uVar20),auVar51);
        auVar32._0_4_ = fVar10 * auVar27._0_4_;
        auVar32._4_4_ = fVar10 * auVar27._4_4_;
        auVar32._8_4_ = fVar10 * auVar27._8_4_;
        auVar32._12_4_ = fVar10 * auVar27._12_4_;
        auVar27 = vsubps_avx(*(undefined1 (*) [16])(sVar25 + 0x20 + (uVar23 ^ 0x10)),auVar49);
        auVar35._0_4_ = fVar4 * auVar27._0_4_;
        auVar35._4_4_ = fVar4 * auVar27._4_4_;
        auVar35._8_4_ = fVar4 * auVar27._8_4_;
        auVar35._12_4_ = fVar4 * auVar27._12_4_;
        auVar27 = vsubps_avx(*(undefined1 (*) [16])(sVar25 + 0x20 + (uVar26 ^ 0x10)),auVar50);
        auVar37._0_4_ = fVar5 * auVar27._0_4_;
        auVar37._4_4_ = fVar5 * auVar27._4_4_;
        auVar37._8_4_ = fVar5 * auVar27._8_4_;
        auVar37._12_4_ = fVar5 * auVar27._12_4_;
        auVar29 = vminps_avx(auVar35,auVar37);
        auVar27 = vsubps_avx(*(undefined1 (*) [16])(sVar25 + 0x20 + (uVar20 ^ 0x10)),auVar51);
        auVar38._0_4_ = fVar6 * auVar27._0_4_;
        auVar38._4_4_ = fVar6 * auVar27._4_4_;
        auVar38._8_4_ = fVar6 * auVar27._8_4_;
        auVar38._12_4_ = fVar6 * auVar27._12_4_;
        auVar27 = vmaxps_avx(auVar32,auVar45);
        auVar30 = vmaxps_avx(auVar30,auVar27);
        auVar27 = vminps_avx(auVar38,auVar47);
        auVar27 = vminps_avx(auVar29,auVar27);
        auVar30 = vcmpps_avx(auVar30,auVar27,2);
LAB_006040f7:
        uVar19 = vmovmskps_avx(auVar30);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar19);
        bVar14 = true;
      }
      else {
        if ((int)(sVar25 & 0xf) == 2) {
          uVar16 = sVar25 & 0xfffffffffffffff0;
          auVar30 = *(undefined1 (*) [16])(uVar16 + 0x80);
          auVar43._0_4_ = fVar3 * auVar30._0_4_;
          auVar43._4_4_ = fVar3 * auVar30._4_4_;
          auVar43._8_4_ = fVar3 * auVar30._8_4_;
          auVar43._12_4_ = fVar3 * auVar30._12_4_;
          auVar27 = *(undefined1 (*) [16])(uVar16 + 0x90);
          auVar44._0_4_ = fVar3 * auVar27._0_4_;
          auVar44._4_4_ = fVar3 * auVar27._4_4_;
          auVar44._8_4_ = fVar3 * auVar27._8_4_;
          auVar44._12_4_ = fVar3 * auVar27._12_4_;
          auVar29 = *(undefined1 (*) [16])(uVar16 + 0xa0);
          auVar46._0_4_ = fVar3 * auVar29._0_4_;
          auVar46._4_4_ = fVar3 * auVar29._4_4_;
          auVar46._8_4_ = fVar3 * auVar29._8_4_;
          auVar46._12_4_ = fVar3 * auVar29._12_4_;
          auVar12._4_4_ = uVar2;
          auVar12._0_4_ = uVar2;
          auVar12._8_4_ = uVar2;
          auVar12._12_4_ = uVar2;
          auVar34 = vfmadd231ps_fma(auVar43,auVar12,*(undefined1 (*) [16])(uVar16 + 0x50));
          auVar43 = vfmadd231ps_fma(auVar44,auVar12,*(undefined1 (*) [16])(uVar16 + 0x60));
          auVar13._4_4_ = uVar1;
          auVar13._0_4_ = uVar1;
          auVar13._8_4_ = uVar1;
          auVar13._12_4_ = uVar1;
          auVar42 = vfmadd231ps_fma(auVar34,auVar13,*(undefined1 (*) [16])(uVar16 + 0x20));
          auVar40 = vfmadd231ps_fma(auVar43,auVar13,*(undefined1 (*) [16])(uVar16 + 0x30));
          auVar48._8_4_ = 0x7fffffff;
          auVar48._0_8_ = 0x7fffffff7fffffff;
          auVar48._12_4_ = 0x7fffffff;
          auVar34 = vandps_avx(auVar48,auVar42);
          auVar41._8_4_ = 0x219392ef;
          auVar41._0_8_ = 0x219392ef219392ef;
          auVar41._12_4_ = 0x219392ef;
          auVar34 = vcmpps_avx(auVar34,auVar41,1);
          auVar43 = vblendvps_avx(auVar42,auVar41,auVar34);
          auVar34 = vandps_avx(auVar40,auVar48);
          auVar34 = vcmpps_avx(auVar34,auVar41,1);
          auVar42 = vblendvps_avx(auVar40,auVar41,auVar34);
          auVar34 = vfmadd231ps_fma(auVar46,auVar12,*(undefined1 (*) [16])(uVar16 + 0x70));
          auVar40 = vfmadd231ps_fma(auVar34,auVar13,*(undefined1 (*) [16])(uVar16 + 0x40));
          auVar34 = vandps_avx(auVar40,auVar48);
          auVar34 = vcmpps_avx(auVar34,auVar41,1);
          auVar34 = vblendvps_avx(auVar40,auVar41,auVar34);
          auVar40 = vrcpps_avx(auVar43);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar43 = vfnmadd213ps_fma(auVar43,auVar40,auVar28);
          auVar40 = vfmadd132ps_fma(auVar43,auVar40,auVar40);
          auVar43 = vrcpps_avx(auVar42);
          auVar42 = vfnmadd213ps_fma(auVar42,auVar43,auVar28);
          auVar42 = vfmadd132ps_fma(auVar42,auVar43,auVar43);
          auVar43 = vrcpps_avx(auVar34);
          auVar34 = vfnmadd213ps_fma(auVar34,auVar43,auVar28);
          auVar34 = vfmadd132ps_fma(auVar34,auVar43,auVar43);
          auVar30 = vfmadd213ps_fma(auVar30,auVar51,*(undefined1 (*) [16])(uVar16 + 0xb0));
          auVar27 = vfmadd213ps_fma(auVar27,auVar51,*(undefined1 (*) [16])(uVar16 + 0xc0));
          auVar43 = vfmadd231ps_fma(auVar30,auVar50,*(undefined1 (*) [16])(uVar16 + 0x50));
          auVar27 = vfmadd231ps_fma(auVar27,auVar50,*(undefined1 (*) [16])(uVar16 + 0x60));
          auVar30 = vfmadd213ps_fma(auVar29,auVar51,*(undefined1 (*) [16])(uVar16 + 0xd0));
          auVar30 = vfmadd231ps_fma(auVar30,auVar50,*(undefined1 (*) [16])(uVar16 + 0x70));
          auVar29 = vfmadd231ps_fma(auVar43,auVar49,*(undefined1 (*) [16])(uVar16 + 0x20));
          auVar36._0_4_ = auVar29._0_4_ * -auVar40._0_4_;
          auVar36._4_4_ = auVar29._4_4_ * -auVar40._4_4_;
          auVar36._8_4_ = auVar29._8_4_ * -auVar40._8_4_;
          auVar36._12_4_ = auVar29._12_4_ * -auVar40._12_4_;
          auVar27 = vfmadd231ps_fma(auVar27,auVar49,*(undefined1 (*) [16])(uVar16 + 0x30));
          auVar33._0_4_ = auVar27._0_4_ * -auVar42._0_4_;
          auVar33._4_4_ = auVar27._4_4_ * -auVar42._4_4_;
          auVar33._8_4_ = auVar27._8_4_ * -auVar42._8_4_;
          auVar33._12_4_ = auVar27._12_4_ * -auVar42._12_4_;
          auVar30 = vfmadd231ps_fma(auVar30,auVar49,*(undefined1 (*) [16])(uVar16 + 0x40));
          auVar29._0_4_ = auVar30._0_4_ * -auVar34._0_4_;
          auVar29._4_4_ = auVar30._4_4_ * -auVar34._4_4_;
          auVar29._8_4_ = auVar30._8_4_ * -auVar34._8_4_;
          auVar29._12_4_ = auVar30._12_4_ * -auVar34._12_4_;
          auVar39._0_4_ = auVar40._0_4_ + auVar36._0_4_;
          auVar39._4_4_ = auVar40._4_4_ + auVar36._4_4_;
          auVar39._8_4_ = auVar40._8_4_ + auVar36._8_4_;
          auVar39._12_4_ = auVar40._12_4_ + auVar36._12_4_;
          auVar40._0_4_ = auVar42._0_4_ + auVar33._0_4_;
          auVar40._4_4_ = auVar42._4_4_ + auVar33._4_4_;
          auVar40._8_4_ = auVar42._8_4_ + auVar33._8_4_;
          auVar40._12_4_ = auVar42._12_4_ + auVar33._12_4_;
          auVar42._0_4_ = auVar34._0_4_ + auVar29._0_4_;
          auVar42._4_4_ = auVar34._4_4_ + auVar29._4_4_;
          auVar42._8_4_ = auVar34._8_4_ + auVar29._8_4_;
          auVar42._12_4_ = auVar34._12_4_ + auVar29._12_4_;
          auVar30 = vpminsd_avx(auVar33,auVar40);
          auVar27 = vpminsd_avx(auVar29,auVar42);
          auVar30 = vmaxps_avx(auVar30,auVar27);
          auVar43 = vpminsd_avx(auVar36,auVar39);
          auVar34 = vpmaxsd_avx(auVar36,auVar39);
          auVar27 = vpmaxsd_avx(auVar33,auVar40);
          auVar29 = vpmaxsd_avx(auVar29,auVar42);
          auVar29 = vminps_avx(auVar27,auVar29);
          auVar27 = vmaxps_avx(auVar45,auVar43);
          auVar30 = vmaxps_avx(auVar27,auVar30);
          auVar27 = vminps_avx(auVar47,auVar34);
          auVar27 = vminps_avx(auVar27,auVar29);
          auVar34._0_4_ = auVar30._0_4_ * 0.99999964;
          auVar34._4_4_ = auVar30._4_4_ * 0.99999964;
          auVar34._8_4_ = auVar30._8_4_ * 0.99999964;
          auVar34._12_4_ = auVar30._12_4_ * 0.99999964;
          auVar30._0_4_ = auVar27._0_4_ * 1.0000004;
          auVar30._4_4_ = auVar27._4_4_ * 1.0000004;
          auVar30._8_4_ = auVar27._8_4_ * 1.0000004;
          auVar30._12_4_ = auVar27._12_4_ * 1.0000004;
          auVar30 = vcmpps_avx(auVar34,auVar30,2);
          goto LAB_006040f7;
        }
        bVar14 = false;
      }
      if (bVar14) {
        if (unaff_RBX == 0) {
          uVar17 = 4;
        }
        else {
          uVar24 = sVar25 & 0xfffffffffffffff0;
          lVar18 = 0;
          for (uVar16 = unaff_RBX; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar17 = 0;
          for (uVar16 = unaff_RBX - 1 & unaff_RBX; sVar25 = *(size_t *)(uVar24 + lVar18 * 8),
              uVar16 != 0; uVar16 = uVar16 - 1 & uVar16) {
            pNVar22->ptr = sVar25;
            pNVar22 = pNVar22 + 1;
            lVar18 = 0;
            for (uVar11 = uVar16; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
          }
        }
      }
      else {
        uVar17 = 6;
      }
    } while (uVar17 == 0);
    if (uVar17 == 6) {
      cVar15 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar25 & 0xfffffffffffffff0) * 0x40 + 0x28))(pre,ray,k);
      uVar17 = 0;
      if (cVar15 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar17 = 1;
      }
    }
  } while ((uVar17 & 3) == 0);
  return pNVar21 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }